

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeView::rowHeight(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  int iVar1;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  iVar1 = QTreeViewPrivate::viewIndex(this_00,index);
  if (iVar1 != -1) {
    iVar1 = QTreeViewPrivate::itemHeight(this_00,iVar1);
    return iVar1;
  }
  return 0;
}

Assistant:

int QTreeView::rowHeight(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (i == -1)
        return 0;
    return d->itemHeight(i);
}